

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

bool __thiscall
glcts::ViewportArray::ViewportIndexSubroutine::checkResults
          (ViewportIndexSubroutine *this,texture *texture_0,texture *param_2,GLuint draw_call_index)

{
  bool bVar1;
  GLuint x;
  GLuint GVar2;
  GLuint y;
  uint y_00;
  GLuint x_1;
  GLuint x_00;
  vector<int,_std::allocator<int>_> texture_data;
  
  texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&texture_data,0x4000);
  Utils::texture::get(texture_0,0x8d94,0x1404,
                      texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
  for (y_00 = 0; y_00 != 4; y_00 = y_00 + 1) {
    GVar2 = 0;
    while (GVar2 != 2) {
      bVar1 = DrawTestBase::checkRegionR32I
                        (&this->super_DrawTestBase,GVar2,y_00,4,
                         texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
      GVar2 = GVar2 + 1;
      if (!bVar1) {
        if (y_00 < 4) goto LAB_00d8c7cf;
        goto LAB_00d8c797;
      }
    }
  }
LAB_00d8c797:
  for (GVar2 = 0; GVar2 != 4; GVar2 = GVar2 + 1) {
    x_00 = 2;
    while (x_00 != 4) {
      bVar1 = DrawTestBase::checkRegionR32I
                        (&this->super_DrawTestBase,x_00,GVar2,-(uint)(draw_call_index != 1) | 5,
                         texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
      x_00 = x_00 + 1;
      if (!bVar1) goto LAB_00d8c7cf;
    }
  }
  bVar1 = true;
LAB_00d8c7d1:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&texture_data.super__Vector_base<int,_std::allocator<int>_>);
  return bVar1;
LAB_00d8c7cf:
  bVar1 = false;
  goto LAB_00d8c7d1;
}

Assistant:

bool ViewportIndexSubroutine::checkResults(Utils::texture& texture_0, Utils::texture& /* texture_1 */,
										   GLuint		   draw_call_index)
{
	bool check_result = true;

	std::vector<GLint> texture_data;
	texture_data.resize(m_width * m_height);
	texture_0.get(GL_RED_INTEGER, GL_INT, &texture_data[0]);

	/* Left is 4 and right is -1, or left is 4 and right is 5 */
	GLint expected_left  = 4;
	GLint expected_right = (1 == draw_call_index) ? 5 : -1;

	for (GLuint y = 0; y < 4; ++y)
	{
		for (GLuint x = 0; x < 2; ++x)
		{
			bool result = checkRegionR32I(x, y, expected_left, &texture_data[0]);

			if (false == result)
			{
				check_result = false;
				goto end;
			}
		}
	}

	for (GLuint y = 0; y < 4; ++y)
	{
		for (GLuint x = 2; x < 4; ++x)
		{
			bool result = checkRegionR32I(x, y, expected_right, &texture_data[0]);

			if (false == result)
			{
				check_result = false;
				goto end;
			}
		}
	}

end:
	return check_result;
}